

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O2

int hfile_oflags(char *mode)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  do {
    cVar1 = *mode;
    if (cVar1 == '+') {
      uVar3 = 2;
    }
    else if (cVar1 == 'a') {
      uVar2 = uVar2 | 0x440;
LAB_0010df6f:
      uVar3 = 1;
    }
    else if (cVar1 == 'r') {
      uVar3 = 0;
    }
    else {
      if (cVar1 == 'w') {
        uVar2 = uVar2 | 0x240;
        goto LAB_0010df6f;
      }
      if (cVar1 == '\0') {
        return uVar2 | uVar3;
      }
    }
    mode = mode + 1;
  } while( true );
}

Assistant:

int hfile_oflags(const char *mode)
{
    int rdwr = 0, flags = 0;
    const char *s;
    for (s = mode; *s; s++)
        switch (*s) {
        case 'r': rdwr = O_RDONLY;  break;
        case 'w': rdwr = O_WRONLY; flags |= O_CREAT | O_TRUNC;  break;
        case 'a': rdwr = O_WRONLY; flags |= O_CREAT | O_APPEND;  break;
        case '+': rdwr = O_RDWR;  break;
        default:  break;
        }

#ifdef O_BINARY
    flags |= O_BINARY;
#endif

    return rdwr | flags;
}